

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectedEnergyAreaAimpoint.cpp
# Opt level: O1

bool __thiscall
DIS::DirectedEnergyAreaAimpoint::operator==
          (DirectedEnergyAreaAimpoint *this,DirectedEnergyAreaAimpoint *rhs)

{
  bool bVar1;
  bool bVar2;
  pointer pBVar3;
  pointer pDVar4;
  long lVar5;
  ulong uVar6;
  
  bVar2 = (this->_padding == rhs->_padding && rhs->_recordLength == this->_recordLength) &&
          this->_recordType == rhs->_recordType;
  pBVar3 = (this->_beamAntennaParameterList).
           super__Vector_base<DIS::BeamAntennaPattern,_std::allocator<DIS::BeamAntennaPattern>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_beamAntennaParameterList).
      super__Vector_base<DIS::BeamAntennaPattern,_std::allocator<DIS::BeamAntennaPattern>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar3) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      bVar1 = BeamAntennaPattern::operator==
                        ((BeamAntennaPattern *)((long)&pBVar3->_vptr_BeamAntennaPattern + lVar5),
                         (BeamAntennaPattern *)
                         ((long)&((rhs->_beamAntennaParameterList).
                                  super__Vector_base<DIS::BeamAntennaPattern,_std::allocator<DIS::BeamAntennaPattern>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 _vptr_BeamAntennaPattern + lVar5));
      if (!bVar1) {
        bVar2 = false;
      }
      uVar6 = uVar6 + 1;
      pBVar3 = (this->_beamAntennaParameterList).
               super__Vector_base<DIS::BeamAntennaPattern,_std::allocator<DIS::BeamAntennaPattern>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x40;
    } while (uVar6 < (ulong)((long)(this->_beamAntennaParameterList).
                                   super__Vector_base<DIS::BeamAntennaPattern,_std::allocator<DIS::BeamAntennaPattern>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3 >> 6));
  }
  pDVar4 = (this->_directedEnergyTargetEnergyDepositionRecordList).
           super__Vector_base<DIS::DirectedEnergyTargetEnergyDeposition,_std::allocator<DIS::DirectedEnergyTargetEnergyDeposition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_directedEnergyTargetEnergyDepositionRecordList).
      super__Vector_base<DIS::DirectedEnergyTargetEnergyDeposition,_std::allocator<DIS::DirectedEnergyTargetEnergyDeposition>_>
      ._M_impl.super__Vector_impl_data._M_finish != pDVar4) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      bVar1 = DirectedEnergyTargetEnergyDeposition::operator==
                        ((DirectedEnergyTargetEnergyDeposition *)
                         ((long)&pDVar4->_vptr_DirectedEnergyTargetEnergyDeposition + lVar5),
                         (DirectedEnergyTargetEnergyDeposition *)
                         ((long)&((rhs->_directedEnergyTargetEnergyDepositionRecordList).
                                  super__Vector_base<DIS::DirectedEnergyTargetEnergyDeposition,_std::allocator<DIS::DirectedEnergyTargetEnergyDeposition>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 _vptr_DirectedEnergyTargetEnergyDeposition + lVar5));
      if (!bVar1) {
        bVar2 = false;
      }
      uVar6 = uVar6 + 1;
      pDVar4 = (this->_directedEnergyTargetEnergyDepositionRecordList).
               super__Vector_base<DIS::DirectedEnergyTargetEnergyDeposition,_std::allocator<DIS::DirectedEnergyTargetEnergyDeposition>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x30;
    } while (uVar6 < (ulong)(((long)(this->_directedEnergyTargetEnergyDepositionRecordList).
                                    super__Vector_base<DIS::DirectedEnergyTargetEnergyDeposition,_std::allocator<DIS::DirectedEnergyTargetEnergyDeposition>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar4 >> 4)
                            * -0x5555555555555555));
  }
  return bVar2;
}

Assistant:

bool DirectedEnergyAreaAimpoint::operator ==(const DirectedEnergyAreaAimpoint& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_recordType == rhs._recordType) ) ivarsEqual = false;
     if( ! (_recordLength == rhs._recordLength) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _beamAntennaParameterList.size(); idx++)
     {
        if( ! ( _beamAntennaParameterList[idx] == rhs._beamAntennaParameterList[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _directedEnergyTargetEnergyDepositionRecordList.size(); idx++)
     {
        if( ! ( _directedEnergyTargetEnergyDepositionRecordList[idx] == rhs._directedEnergyTargetEnergyDepositionRecordList[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }